

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O3

void __thiscall duckdb::ZSTDCompressionState::InitializeVector(ZSTDCompressionState *this)

{
  unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true> *this_00
  ;
  optional_ptr<duckdb::BufferHandle,_true> *this_01;
  BufferHandle *pBVar1;
  BlockManager *pBVar2;
  BufferHandle *pBVar3;
  ZSTD_CCtx *cctx;
  int value;
  idx_t iVar4;
  pointer pZVar5;
  idx_t iVar6;
  idx_t iVar7;
  block_id_t bVar8;
  string_length_t *psVar9;
  ulong uVar10;
  uint uVar11;
  
  iVar4 = 0x800;
  if (this->total_vector_count <= this->vector_count + 1) {
    pZVar5 = unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
             ::operator->(&this->analyze_state);
    iVar4 = pZVar5->count + this->vector_count * -0x800;
  }
  this->vector_size = iVar4;
  this_01 = &this->current_buffer;
  optional_ptr<duckdb::BufferHandle,_true>::CheckValid(this_01);
  pBVar1 = (this->current_buffer).ptr;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar1->node);
  uVar10 = (ulong)((*(int *)&this->current_buffer_ptr - *(int *)&((pBVar1->node).ptr)->buffer) + 3U
                  & 0xfffffffc);
  optional_ptr<duckdb::BufferHandle,_true>::CheckValid(this_01);
  pBVar1 = (this->current_buffer).ptr;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar1->node);
  this->current_buffer_ptr = ((pBVar1->node).ptr)->buffer + uVar10;
  this->uncompressed_size = 0;
  this->compressed_size = 0;
  pBVar2 = (this->super_CompressionState).info.block_manager;
  iVar4 = this->vector_in_segment_count;
  iVar6 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
  iVar7 = optional_idx::GetIndex(&pBVar2->block_header_size);
  if ((iVar6 - iVar7) - 8 < (iVar4 * 0x14 + 0x1b & 0xfffffffffffffff8) + iVar4 * 8 + 8) {
    NewSegment(this);
  }
  pBVar2 = (this->super_CompressionState).info.block_manager;
  iVar4 = this->vector_size;
  iVar6 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
  iVar7 = optional_idx::GetIndex(&pBVar2->block_header_size);
  if ((iVar6 - iVar7) - 8 <= uVar10 + iVar4 * 4) {
    NewPage(this,false);
  }
  optional_ptr<duckdb::BufferHandle,_true>::CheckValid(this_01);
  pBVar1 = (this->current_buffer).ptr;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar1->node);
  pBVar3 = (this->current_buffer).ptr;
  uVar11 = (int)this->current_buffer_ptr - (int)((pBVar1->node).ptr)->buffer;
  this->starting_offset = uVar11;
  bVar8 = -1;
  if (&this->segment_handle != pBVar3) {
    bVar8 = this->block_id;
  }
  this->starting_page = bVar8;
  (this->vector_lengths_buffer).ptr = pBVar3;
  optional_ptr<duckdb::BufferHandle,_true>::CheckValid(this_01);
  pBVar1 = (this->current_buffer).ptr;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar1->node);
  psVar9 = (string_length_t *)(((pBVar1->node).ptr)->buffer + uVar11);
  this->string_lengths = psVar9;
  this->current_buffer_ptr = (data_ptr_t)(psVar9 + this->vector_size);
  ResetOutBuffer(this);
  this_00 = &this->analyze_state;
  pZVar5 = unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
           ::operator->(this_00);
  duckdb_zstd::ZSTD_CCtx_reset(pZVar5->context,ZSTD_reset_session_only);
  pZVar5 = unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
           ::operator->(this_00);
  duckdb_zstd::ZSTD_CCtx_refCDict(pZVar5->context,(ZSTD_CDict *)0x0);
  pZVar5 = unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
           ::operator->(this_00);
  cctx = pZVar5->context;
  value = duckdb_zstd::ZSTD_defaultCLevel();
  duckdb_zstd::ZSTD_CCtx_setParameter(cctx,ZSTD_c_compressionLevel,value);
  this->in_vector = true;
  return;
}

Assistant:

void InitializeVector() {
		D_ASSERT(!in_vector);
		if (vector_count + 1 >= total_vector_count) {
			vector_size = analyze_state->count - (ZSTD_VECTOR_SIZE * vector_count);
		} else {
			vector_size = ZSTD_VECTOR_SIZE;
		}
		auto current_offset = GetCurrentOffset();
		current_offset = UnsafeNumericCast<page_offset_t>(
		    AlignValue<idx_t, sizeof(string_length_t)>(UnsafeNumericCast<idx_t>(current_offset)));
		current_buffer_ptr = current_buffer->Ptr() + current_offset;
		compressed_size = 0;
		uncompressed_size = 0;

		if (GetVectorMetadataSize(vector_in_segment_count + 1) > GetWritableSpace(info)) {
			D_ASSERT(vector_in_segment_count <= vectors_per_segment);
			// Can't fit this vector on this segment anymore, have to flush and a grab new one
			NewSegment();
		}

		if (current_offset + (vector_size * sizeof(string_length_t)) >= GetWritableSpace(info)) {
			// Check if there is room on the current page for the vector data
			NewPage();
		}
		current_offset = GetCurrentOffset();
		starting_offset = current_offset;
		starting_page = GetCurrentId();

		vector_lengths_buffer = current_buffer;
		string_lengths = reinterpret_cast<string_length_t *>(current_buffer->Ptr() + current_offset);
		current_buffer_ptr = reinterpret_cast<data_ptr_t>(string_lengths);
		current_buffer_ptr += vector_size * sizeof(string_length_t);
		// 'out_buffer' should be set to point directly after the string_lengths
		ResetOutBuffer();

		// Initialize the context for streaming compression
		duckdb_zstd::ZSTD_CCtx_reset(analyze_state->context, duckdb_zstd::ZSTD_reset_session_only);
		duckdb_zstd::ZSTD_CCtx_refCDict(analyze_state->context, nullptr);
		duckdb_zstd::ZSTD_CCtx_setParameter(analyze_state->context, duckdb_zstd::ZSTD_c_compressionLevel,
		                                    GetCompressionLevel());
		in_vector = true;
	}